

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ScalarType * __thiscall
slang::BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind_const&,bool&>
          (BumpAllocator *this,Kind *args,bool *args_1)

{
  ScalarType *this_00;
  
  this_00 = (ScalarType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ScalarType *)this->endPtr < this_00 + 1) {
    this_00 = (ScalarType *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::ScalarType::ScalarType(this_00,*args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }